

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luac.c
# Opt level: O3

int pmain(lua_State *L)

{
  long lVar1;
  char cVar2;
  Instruction *pIVar3;
  LocVar *pLVar4;
  Upvaldesc *pUVar5;
  int iVar6;
  uint uVar7;
  int extraout_EAX;
  lua_Integer lVar8;
  void *pvVar9;
  FILE *__stream;
  long lVar10;
  Proto **ppPVar11;
  ulong uVar12;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  char *pcVar17;
  long lVar18;
  byte bVar19;
  uint full;
  uint uVar20;
  uint uVar21;
  char *pcVar22;
  Proto *pPVar24;
  Proto *pPVar25;
  uint uVar26;
  uint uVar28;
  char *pcVar29;
  char *pcVar30;
  ulong uVar31;
  uint uVar32;
  uint i;
  uint i_00;
  uint local_2c;
  ulong uVar23;
  ulong uVar27;
  
  lVar8 = lua_tointegerx(L,1,(int *)0x0);
  pvVar9 = lua_touserdata(L,2);
  tmname = L->l_G->tmname;
  uVar32 = (uint)lVar8;
  full = uVar32;
  iVar6 = lua_checkstack(L,uVar32);
  if (iVar6 == 0) {
LAB_00103caf:
    pmain_cold_3();
LAB_00103cb4:
    pmain_cold_2();
LAB_00103cbc:
    cannot("open");
  }
  else {
    if ((int)uVar32 < 1) {
LAB_00103b8e:
      full = 0x10488b;
      local_2c = uVar32;
      iVar6 = lua_load(L,reader,&local_2c,"=(luac)",(char *)0x0);
      if (iVar6 != 0) goto LAB_00103cb4;
      pPVar25 = *(Proto **)(*(long *)((L->top).offset + -0x10) + 0x18);
      if (0 < (int)uVar32) {
        ppPVar11 = pPVar25->p;
        lVar10 = (long)(int)~uVar32 << 4;
        uVar31 = 0;
        do {
          ppPVar11[uVar31] = *(Proto **)(*(long *)((long)(L->top).p + lVar10) + 0x18);
          ppPVar11 = pPVar25->p;
          pPVar24 = ppPVar11[uVar31];
          if (0 < pPVar24->sizeupvalues) {
            pPVar24 = (Proto *)pPVar24->upvalues;
            pPVar24->tt = '\0';
          }
          full = (uint)pPVar24;
          uVar31 = uVar31 + 1;
          lVar10 = lVar10 + 0x10;
        } while ((uVar32 & 0x7fffffff) != uVar31);
      }
    }
    else {
      uVar31 = 0;
      do {
        pcVar13 = *(char **)((long)pvVar9 + uVar31 * 8);
        if ((*pcVar13 == '-') && (pcVar13[1] == '\0')) {
          pcVar13 = (char *)0x0;
        }
        iVar6 = luaL_loadfilex(L,pcVar13,(char *)0x0);
        full = (uint)pcVar13;
        if (iVar6 != 0) {
          pmain_cold_1();
          goto LAB_00103caf;
        }
        uVar31 = uVar31 + 1;
      } while ((uVar32 & 0x7fffffff) != uVar31);
      if (uVar32 != 1) goto LAB_00103b8e;
      pPVar25 = *(Proto **)(*(long *)((L->top).offset + -0x10) + 0x18);
    }
    if (listing != 0) {
      full = (uint)(1 < listing);
      PrintFunction(pPVar25,(uint)(1 < listing));
    }
    if (dumping != '\0') {
      return 0;
    }
    __stream = _stdout;
    if (output != (char *)0x0) {
      full = 0x11f3c7;
      __stream = fopen64(output,"wb");
    }
    if (__stream == (FILE *)0x0) goto LAB_00103cbc;
    luaU_dump(L,pPVar25,writer,__stream,(uint)stripping);
    full = (uint)pPVar25;
    iVar6 = ferror(__stream);
    if (iVar6 == 0) {
      iVar6 = fclose(__stream);
      if (iVar6 == 0) {
        return 0;
      }
      goto LAB_00103cd4;
    }
  }
  cannot("write");
LAB_00103cd4:
  pPVar25 = (Proto *)0x120580;
  cannot("close");
  pcVar13 = "=?";
  if (pPVar25->source != (TString *)0x0) {
    pcVar13 = pPVar25->source->contents;
  }
  cVar2 = *pcVar13;
  if (cVar2 == '\x1b') {
    pcVar13 = "(bstring)";
  }
  else if ((cVar2 == '@') || (cVar2 == '=')) {
    pcVar13 = pcVar13 + 1;
  }
  else {
    pcVar13 = "(string)";
  }
  uVar32 = pPVar25->sizep;
  pcVar22 = "function";
  if (pPVar25->linedefined == 0) {
    pcVar22 = "main";
  }
  pcVar17 = "s";
  pcVar29 = "s";
  if (pPVar25->sizecode == 1) {
    pcVar29 = "";
  }
  printf("\n%s <%s:%d,%d> (%d instruction%s at %p)\n",pcVar22,pcVar13,
         (ulong)(uint)pPVar25->linedefined,(ulong)(uint)pPVar25->lastlinedefined,
         (ulong)(uint)pPVar25->sizecode,pcVar29,pPVar25);
  pcVar13 = "+";
  if (pPVar25->is_vararg == '\0') {
    pcVar13 = "";
  }
  pcVar22 = "s";
  if (pPVar25->numparams == 1) {
    pcVar22 = "";
  }
  pcVar29 = "s";
  if (pPVar25->maxstacksize == 1) {
    pcVar29 = "";
  }
  pcVar30 = "s";
  if (pPVar25->sizeupvalues == 1) {
    pcVar30 = "";
  }
  printf("%d%s param%s, %d slot%s, %d upvalue%s, ",(ulong)pPVar25->numparams,pcVar13,pcVar22,
         (ulong)pPVar25->maxstacksize,pcVar29,(ulong)(uint)pPVar25->sizeupvalues,pcVar30);
  pcVar13 = "s";
  if (pPVar25->sizelocvars == 1) {
    pcVar13 = "";
  }
  pcVar22 = "s";
  if (pPVar25->sizek == 1) {
    pcVar22 = "";
  }
  if (pPVar25->sizep == 1) {
    pcVar17 = "";
  }
  printf("%d local%s, %d constant%s, %d function%s\n",(ulong)(uint)pPVar25->sizelocvars,pcVar13,
         (ulong)(uint)pPVar25->sizek,pcVar22,(ulong)(uint)pPVar25->sizep,pcVar17,pcVar30);
  iVar6 = pPVar25->sizecode;
  lVar10 = (long)iVar6;
  if (0 < lVar10) {
    pIVar3 = pPVar25->code;
    lVar18 = 0;
    do {
      uVar21 = pIVar3[lVar18];
      iVar6 = (int)lVar18;
      uVar7 = luaG_getfuncline(pPVar25,iVar6);
      lVar1 = lVar18 + 1;
      printf("\t%d\t");
      if ((int)uVar7 < 1) {
        printf("[-]\t");
      }
      else {
        printf("[%d]\t",(ulong)uVar7);
      }
      uVar7 = uVar21 & 0x7f;
      printf("%-9s\t",opnames[uVar7]);
      if (0x52 < uVar7) goto switchD_00103f0f_caseD_47;
      uVar20 = uVar21 >> 7;
      uVar23 = (ulong)uVar20;
      uVar28 = uVar20 & 0xff;
      i_00 = uVar21 >> 0x10 & 0xff;
      uVar15 = (ulong)i_00;
      uVar26 = uVar21 >> 0x18;
      uVar27 = (ulong)uVar26;
      i = uVar21 >> 0xf;
      uVar14 = (ulong)(i_00 - 0x7f);
      uVar12 = (ulong)(uVar26 - 0x7f);
      uVar16 = i & 1;
      uVar31 = (ulong)uVar16;
      switch(uVar7) {
      case 0:
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
        goto LAB_001042cc;
      case 1:
      case 2:
        uVar15 = (ulong)(i - 0xffff);
        goto LAB_001042cc;
      case 3:
        printf("%d %d",(ulong)uVar28,(ulong)i,uVar12);
        printf("\t; ");
        pPVar24 = (Proto *)pPVar25->k;
        goto LAB_00103f59;
      case 4:
        printf("%d",(ulong)uVar28,uVar14,uVar12);
        printf("\t; ");
        pPVar24 = (Proto *)pPVar25->k;
        i = pIVar3[lVar18 + 1] >> 7;
        goto LAB_00103f59;
      case 5:
      case 6:
      case 7:
      case 0x36:
      case 0x37:
      case 0x48:
      case 0x51:
        pcVar13 = "%d";
        uVar23 = (ulong)uVar28;
        break;
      case 8:
        printf("%d %d",(ulong)uVar28,uVar15,uVar12);
        uVar23 = (ulong)(i_00 + 1);
        pcVar13 = "\t; %d out";
        break;
      case 9:
      case 10:
        printf("%d %d",(ulong)uVar28,uVar15,uVar12);
        lVar18 = *(long *)((long)&pPVar25->upvalues->name + (ulong)(i_00 << 4));
        pPVar24 = (Proto *)"-";
        if (lVar18 != 0) {
          pPVar24 = (Proto *)(lVar18 + 0x18);
        }
        goto LAB_00104425;
      case 0xb:
        printf("%d %d %d",(ulong)uVar28,uVar15,uVar27);
        lVar18 = *(long *)((long)&pPVar25->upvalues->name + (ulong)(i_00 << 4));
        pcVar13 = "-";
        if (lVar18 != 0) {
          pcVar13 = (char *)(lVar18 + 0x18);
        }
        printf("\t; %s",pcVar13);
        putchar(0x20);
        pPVar24 = (Proto *)pPVar25->k;
        i = uVar26;
        goto LAB_00103f59;
      default:
        uVar31 = uVar27;
        uVar14 = uVar15;
        goto LAB_00103ff5;
      case 0xe:
      case 0x16:
      case 0x17:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
      case 0x1c:
      case 0x1d:
      case 0x1e:
      case 0x1f:
        printf("%d %d %d",(ulong)uVar28,uVar15,uVar27);
LAB_00103f49:
        printf("\t; ");
        goto LAB_00103f4e;
      case 0xf:
        pcVar13 = "break";
        if (uVar16 == 0) {
          pcVar13 = "[-]\t";
        }
        printf("%d %d %d%s",(ulong)uVar28,uVar15,uVar27,pcVar13 + 4);
        lVar18 = *(long *)((long)&pPVar25->upvalues->name + (ulong)(uVar28 << 4));
        pcVar13 = "-";
        if (lVar18 != 0) {
          pcVar13 = (char *)(lVar18 + 0x18);
        }
        printf("\t; %s",pcVar13);
        putchar(0x20);
        PrintConstant((Proto *)pPVar25->k,i_00);
        goto joined_r0x001041c0;
      case 0x10:
      case 0x11:
      case 0x14:
        pcVar13 = "break";
        if (uVar16 == 0) {
          pcVar13 = "[-]\t";
        }
        printf("%d %d %d%s",(ulong)uVar28,uVar15,uVar27,pcVar13 + 4);
        if (uVar16 != 0) goto LAB_00103f49;
        goto switchD_00103f0f_caseD_47;
      case 0x12:
        pcVar13 = "break";
        if (uVar16 == 0) {
          pcVar13 = "[-]\t";
        }
        printf("%d %d %d%s",(ulong)uVar28,uVar15,uVar27,pcVar13 + 4);
        printf("\t; ");
        PrintConstant((Proto *)pPVar25->k,i_00);
joined_r0x001041c0:
        if (uVar16 != 0) {
          putchar(0x20);
LAB_00103f4e:
          pPVar24 = (Proto *)pPVar25->k;
          i = uVar26;
          goto LAB_00103f59;
        }
        goto switchD_00103f0f_caseD_47;
      case 0x13:
        printf("%d %d %d",(ulong)uVar28,uVar15,uVar27);
        uVar21 = pIVar3[lVar18 + 1];
LAB_0010454b:
        uVar23 = (ulong)(uVar26 + (uVar21 & 0x3fffff80) * 2);
        pcVar13 = "\t; %d";
        break;
      case 0x15:
      case 0x20:
      case 0x21:
        uVar31 = uVar12;
        uVar14 = uVar15;
        goto LAB_00103ff5;
      case 0x2e:
        printf("%d %d %d",(ulong)uVar28,uVar15,uVar27);
        pPVar24 = (Proto *)tmname[uVar27]->contents;
LAB_00104425:
        pcVar13 = "\t; %s";
LAB_0010442c:
        printf(pcVar13,pPVar24);
        goto switchD_00103f0f_caseD_47;
      case 0x2f:
        printf("%d %d %d %d",(ulong)uVar28,uVar14,uVar27,uVar31);
        printf("\t; %s",tmname[uVar27]->contents);
        goto LAB_0010450c;
      case 0x30:
        printf("%d %d %d %d",(ulong)uVar28,uVar15,uVar27,uVar31);
        printf("\t; %s ",tmname[uVar27]->contents);
        PrintConstant((Proto *)pPVar25->k,i_00);
LAB_0010450c:
        if (uVar16 != 0) {
          pcVar13 = " flip";
LAB_001045fc:
          printf(pcVar13);
        }
        goto switchD_00103f0f_caseD_47;
      case 0x38:
        printf("%d",(ulong)(uVar20 - 0xffffff),uVar14,uVar12);
        uVar21 = iVar6 + -0xfffffd + (uVar21 >> 7);
        goto LAB_001045b4;
      case 0x39:
      case 0x3a:
      case 0x3b:
      case 0x43:
        uVar14 = uVar15;
        goto LAB_00103ff5;
      case 0x3c:
        printf("%d %d %d",(ulong)uVar28,uVar15,uVar31);
        printf("\t; ");
        pPVar24 = (Proto *)pPVar25->k;
        i = i_00;
LAB_00103f59:
        PrintConstant(pPVar24,i);
        goto switchD_00103f0f_caseD_47;
      case 0x3d:
      case 0x3e:
      case 0x3f:
      case 0x40:
      case 0x41:
LAB_00103ff5:
        printf("%d %d %d",(ulong)uVar28,uVar14,uVar31);
        goto switchD_00103f0f_caseD_47;
      case 0x42:
        uVar15 = uVar31;
        goto LAB_001042cc;
      case 0x44:
        printf("%d %d %d",(ulong)uVar28,uVar15,uVar27);
        printf("\t; ");
        if (i_00 == 0) {
          printf("all in ");
        }
        else {
          printf("%d in ",(ulong)(i_00 - 1));
        }
        if (0xffffff < uVar21) {
          uVar23 = (ulong)(uVar26 - 1);
          pcVar13 = "%d out";
          break;
        }
LAB_001045f5:
        pcVar13 = "all out";
        goto LAB_001045fc;
      case 0x45:
        pcVar13 = "break";
        if (uVar16 == 0) {
          pcVar13 = "[-]\t";
        }
        printf("%d %d %d%s",(ulong)uVar28,uVar15,uVar27,pcVar13 + 4);
        uVar23 = (ulong)(i_00 - 1);
        pcVar13 = "\t; %d in";
        break;
      case 0x46:
        pcVar13 = "break";
        if (uVar16 == 0) {
          pcVar13 = "[-]\t";
        }
        printf("%d %d %d%s",(ulong)uVar28,uVar15,uVar27,pcVar13 + 4);
        printf("\t; ");
        if (i_00 == 0) goto LAB_001045f5;
        uVar23 = (ulong)(i_00 - 1);
        pcVar13 = "%d out";
        break;
      case 0x47:
        goto switchD_00103f0f_caseD_47;
      case 0x49:
      case 0x4d:
        printf("%d %d",(ulong)uVar28,(ulong)i,uVar12);
        pcVar13 = "\t; to %d";
        uVar23 = (ulong)((iVar6 - i) + 2);
        break;
      case 0x4a:
        printf("%d %d",(ulong)uVar28,(ulong)i,uVar12);
        uVar23 = (ulong)(iVar6 + 3 + (uVar21 >> 0xf));
        pcVar13 = "\t; exit to %d";
        break;
      case 0x4b:
        printf("%d %d",(ulong)uVar28,(ulong)i,uVar12);
        uVar21 = iVar6 + 2 + (uVar21 >> 0xf);
LAB_001045b4:
        uVar23 = (ulong)uVar21;
        pcVar13 = "\t; to %d";
        break;
      case 0x4c:
        uVar15 = uVar27;
LAB_001042cc:
        printf("%d %d",(ulong)uVar28,uVar15,uVar12);
        goto switchD_00103f0f_caseD_47;
      case 0x4e:
        printf("%d %d %d",(ulong)uVar28,uVar15,uVar27);
        if (uVar16 != 0) {
          uVar21 = pIVar3[lVar18 + 1];
          goto LAB_0010454b;
        }
        goto switchD_00103f0f_caseD_47;
      case 0x4f:
        printf("%d %d",(ulong)uVar28,(ulong)i,uVar12);
        pPVar24 = pPVar25->p[i];
        pcVar13 = "\t; %p";
        goto LAB_0010442c;
      case 0x50:
        printf("%d %d",(ulong)uVar28,uVar27,uVar12);
        printf("\t; ");
        if (uVar21 < 0x1000000) goto LAB_001045f5;
        pcVar13 = "%d out";
        uVar23 = (ulong)(uVar26 - 1);
        break;
      case 0x52:
        pcVar13 = "%d";
      }
      printf(pcVar13,uVar23);
switchD_00103f0f_caseD_47:
      iVar6 = putchar(10);
      lVar18 = lVar1;
    } while (lVar10 != lVar1);
  }
  if (full != 0) {
    uVar21 = pPVar25->sizek;
    printf("constants (%d) for %p:\n",(ulong)uVar21,pPVar25);
    if (0 < (long)(int)uVar21) {
      lVar10 = 8;
      uVar31 = 0;
      do {
        printf("\t%d\t",uVar31 & 0xffffffff);
        bVar19 = *(byte *)((long)&pPVar25->k->value_ + lVar10) & 0x3f;
        if (0x10 < bVar19) {
          if (bVar19 == 0x11) goto switchD_00104688_caseD_1;
          if (bVar19 != 0x13) {
            if (bVar19 == 0x14) goto switchD_00104688_caseD_4;
            goto switchD_00104688_caseD_2;
          }
          iVar6 = 0x46;
          goto LAB_001046ba;
        }
        switch(bVar19) {
        case 0:
          iVar6 = 0x4e;
          break;
        case 1:
switchD_00104688_caseD_1:
          iVar6 = 0x42;
          break;
        default:
switchD_00104688_caseD_2:
          printf("?%d");
          goto LAB_001046bf;
        case 3:
          iVar6 = 0x49;
          break;
        case 4:
switchD_00104688_caseD_4:
          iVar6 = 0x53;
        }
LAB_001046ba:
        putchar(iVar6);
LAB_001046bf:
        putchar(9);
        PrintConstant((Proto *)pPVar25->k,(int)uVar31);
        putchar(10);
        uVar31 = uVar31 + 1;
        lVar10 = lVar10 + 0x10;
      } while ((long)(int)uVar21 != uVar31);
    }
    uVar21 = pPVar25->sizelocvars;
    printf("locals (%d) for %p:\n",(ulong)uVar21,pPVar25);
    if (0 < (long)(int)uVar21) {
      lVar10 = 0xc;
      uVar31 = 0;
      do {
        pLVar4 = pPVar25->locvars;
        printf("\t%d\t%s\t%d\t%d\n",uVar31 & 0xffffffff,
               *(long *)((long)pLVar4 + lVar10 + -0xc) + 0x18,
               (ulong)(*(int *)((long)pLVar4 + lVar10 + -4) + 1),
               (ulong)(*(int *)((long)&pLVar4->varname + lVar10) + 1));
        uVar31 = uVar31 + 1;
        lVar10 = lVar10 + 0x10;
      } while ((long)(int)uVar21 != uVar31);
    }
    uVar21 = pPVar25->sizeupvalues;
    iVar6 = printf("upvalues (%d) for %p:\n",(ulong)uVar21,pPVar25);
    if (0 < (long)(int)uVar21) {
      lVar10 = 9;
      uVar31 = 0;
      do {
        pUVar5 = pPVar25->upvalues;
        lVar18 = *(long *)((long)pUVar5 + lVar10 + -9);
        pcVar13 = (char *)(lVar18 + 0x18);
        if (lVar18 == 0) {
          pcVar13 = "-";
        }
        iVar6 = printf("\t%d\t%s\t%d\t%d\n",uVar31 & 0xffffffff,pcVar13,
                       (ulong)*(byte *)((long)pUVar5 + lVar10 + -1),
                       (ulong)*(byte *)((long)&pUVar5->name + lVar10));
        uVar31 = uVar31 + 1;
        lVar10 = lVar10 + 0x10;
      } while ((long)(int)uVar21 != uVar31);
    }
  }
  if (0 < (int)uVar32) {
    uVar31 = 0;
    do {
      PrintFunction(pPVar25->p[uVar31],full);
      uVar31 = uVar31 + 1;
      iVar6 = extraout_EAX;
    } while (uVar32 != uVar31);
  }
  return iVar6;
}

Assistant:

static int pmain(lua_State* L)
{
 int argc=(int)lua_tointeger(L,1);
 char** argv=(char**)lua_touserdata(L,2);
 const Proto* f;
 int i;
 tmname=G(L)->tmname;
 if (!lua_checkstack(L,argc)) fatal("too many input files");
 for (i=0; i<argc; i++)
 {
  const char* filename=IS("-") ? NULL : argv[i];
  if (luaL_loadfile(L,filename)!=LUA_OK) fatal(lua_tostring(L,-1));
 }
 f=combine(L,argc);
 if (listing) luaU_print(f,listing>1);
 if (dumping)
 {
  FILE* D= (output==NULL) ? stdout : fopen(output,"wb");
  if (D==NULL) cannot("open");
  lua_lock(L);
  luaU_dump(L,f,writer,D,stripping);
  lua_unlock(L);
  if (ferror(D)) cannot("write");
  if (fclose(D)) cannot("close");
 }
 return 0;
}